

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O1

void __thiscall zmq::session_base_t::timer_event(session_base_t *this,int id_)

{
  if (id_ != 0x20) {
    timer_event();
  }
  this->_has_linger_timer = false;
  if (this->_pipe == (pipe_t *)0x0) {
    timer_event();
  }
  pipe_t::terminate(this->_pipe,false);
  return;
}

Assistant:

void zmq::session_base_t::timer_event (int id_)
{
    //  Linger period expired. We can proceed with termination even though
    //  there are still pending messages to be sent.
    zmq_assert (id_ == linger_timer_id);
    _has_linger_timer = false;

    //  Ask pipe to terminate even though there may be pending messages in it.
    zmq_assert (_pipe);
    _pipe->terminate (false);
}